

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool Catch::list(IEventListener *reporter,Config *config)

{
  bool bVar1;
  undefined1 local_19;
  bool listed;
  Config *config_local;
  IEventListener *reporter_local;
  
  local_19 = Config::listTests(config);
  if (local_19) {
    anon_unknown_26::listTests(reporter,&config->super_IConfig);
  }
  bVar1 = Config::listTags(config);
  if (bVar1) {
    local_19 = true;
    anon_unknown_26::listTags(reporter,&config->super_IConfig);
  }
  bVar1 = Config::listReporters(config);
  if (bVar1) {
    local_19 = true;
    anon_unknown_26::listReporters(reporter);
  }
  bVar1 = Config::listListeners(config);
  if (bVar1) {
    local_19 = true;
    anon_unknown_26::listListeners(reporter);
  }
  return local_19;
}

Assistant:

bool list( IEventListener& reporter, Config const& config ) {
        bool listed = false;
        if (config.listTests()) {
            listed = true;
            listTests(reporter, config);
        }
        if (config.listTags()) {
            listed = true;
            listTags(reporter, config);
        }
        if (config.listReporters()) {
            listed = true;
            listReporters(reporter);
        }
        if ( config.listListeners() ) {
            listed = true;
            listListeners( reporter );
        }
        return listed;
    }